

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O2

void testJacobiEigenSolver<Imath_3_2::Matrix33<float>>(Matrix33<float> *A)

{
  float *pfVar1;
  float *pfVar2;
  uint __line;
  float (*pafVar3) [3];
  uint i;
  long lVar4;
  uint j;
  long lVar5;
  char *__assertion;
  BaseType_conflict2 threshold;
  float fVar6;
  float fVar7;
  TV S;
  Matrix33<float> local_108;
  Matrix33<float> local_d8;
  Matrix33<float> local_a8;
  Matrix33<float> local_84;
  Matrix33<float> MA;
  Matrix33<float> AA;
  
  threshold = computeThreshold<Imath_3_2::Matrix33<float>>(A);
  Imath_3_2::Matrix33<float>::Matrix33(&AA,A);
  local_d8.x[0][0] = 1.0;
  local_d8.x[0][1] = 0.0;
  local_d8.x[0][2] = 0.0;
  local_d8.x[1][0] = 0.0;
  local_d8.x[1][1] = 1.0;
  local_d8.x[1][2] = 0.0;
  local_d8.x[2][0] = 0.0;
  local_d8.x[2][1] = 0.0;
  local_d8.x[2][2] = 1.0;
  Imath_3_2::jacobiEigenSolver<float>(&AA,&S,&local_d8);
  verifyOrthonormal<Imath_3_2::Matrix33<float>>(&local_d8,threshold);
  fVar6 = Imath_3_2::Matrix33<float>::determinant(&local_d8);
  if (threshold <= ABS(fVar6) + -1.0) {
    __assertion = "abs (V.determinant ()) - 1 < threshold";
    __line = 0x67;
  }
  else {
    pafVar3 = (float (*) [3])&local_108;
    local_108.x[0][0] = 1.0;
    local_108.x[0][1] = 0.0;
    local_108.x[0][2] = 0.0;
    local_108.x[1][0] = 0.0;
    local_108.x[1][1] = 1.0;
    local_108.x[1][2] = 0.0;
    local_108.x[2][0] = 0.0;
    local_108.x[2][1] = 0.0;
    local_108.x[2][2] = 1.0;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        if (lVar4 == lVar5) {
          *(float *)((long)local_108.x + lVar4 * 0x10) = (&S.x)[lVar4];
        }
        else {
          (*(float (*) [3])*pafVar3)[lVar5] = 0.0;
        }
      }
      pafVar3 = pafVar3 + 1;
    }
    fVar6 = Imath_3_2::Matrix33<float>::determinant(A);
    fVar7 = Imath_3_2::Matrix33<float>::determinant(&local_108);
    if (ABS(fVar6) - ABS(fVar7) < threshold) {
      Imath_3_2::Matrix33<float>::operator*(&local_d8,&local_108);
      local_a8.x[1][1] = local_d8.x[1][1];
      local_a8.x[1][2] = local_d8.x[2][1];
      local_a8.x[2][0] = local_d8.x[0][2];
      local_a8.x[2][1] = local_d8.x[1][2];
      local_a8.x[0][0] = local_d8.x[0][0];
      local_a8.x[0][1] = local_d8.x[1][0];
      local_a8.x[0][2] = local_d8.x[2][0];
      local_a8.x[1][0] = local_d8.x[0][1];
      local_a8.x[2][2] = local_d8.x[2][2];
      pafVar3 = (float (*) [3])&MA;
      Imath_3_2::Matrix33<float>::operator*(&local_84,&local_a8);
      lVar4 = 0;
      do {
        if (lVar4 == 3) {
          return;
        }
        lVar5 = 0;
        while (lVar5 != 3) {
          pfVar1 = *(float (*) [3])*(float (*) [3])A + lVar5;
          pfVar2 = *(float (*) [3])*pafVar3 + lVar5;
          lVar5 = lVar5 + 1;
          if (threshold <= ABS(*pfVar1 - *pfVar2)) {
            __assertion = "abs (A[i][j] - MA[i][j]) < threshold";
            __line = 0x79;
            goto LAB_0012e782;
          }
        }
        lVar4 = lVar4 + 1;
        A = (Matrix33<float> *)((long)A + 0xc);
        pafVar3 = pafVar3 + 1;
      } while( true );
    }
    __assertion = "abs (A.determinant ()) - abs (MS.determinant ()) < threshold";
    __line = 0x72;
  }
LAB_0012e782:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,__line,"void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix33<float>]");
}

Assistant:

void
testJacobiEigenSolver (const TM& A)
{
    using std::abs;

    typedef typename TM::BaseType    T;
    typedef typename TM::BaseVecType TV;

    const T threshold = computeThreshold (A);

    TM AA (A);
    TV S;
    TM V;

    jacobiEigenSolver (AA, S, V);

    // Orthogonality of V
    verifyOrthonormal (V, threshold);

    // Determinant of V
    assert (abs (V.determinant ()) - 1 < threshold);

    // Determinant of A and S
    TM MS;
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            if (i == j)
                MS[i][j] = S[i];
            else
                MS[i][j] = 0;

    assert (abs (A.determinant ()) - abs (MS.determinant ()) < threshold);

    // A = V * S * V^T
    TM MA = V * MS * V.transposed ();

    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            assert (abs (A[i][j] - MA[i][j]) < threshold);
}